

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

void __thiscall
MakefileGenerator::writeMakeQmake(MakefileGenerator *this,QTextStream *t,bool noDummyQmakeAll)

{
  QMakeProject *pQVar1;
  QArrayData *pQVar2;
  QString string;
  QString file;
  int *piVar3;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  QTextStream *pQVar7;
  ProStringList *pPVar8;
  Data *pDVar9;
  undefined7 in_register_00000011;
  undefined4 uVar10;
  long lVar11;
  Data *pDVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QStringView config;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  QArrayData *in_stack_fffffffffffffea0;
  Data *in_stack_fffffffffffffea8;
  Data *pDStack_150;
  QString local_148;
  undefined1 local_130 [24];
  QString local_118;
  QString local_f8;
  QArrayDataPointer<QString> local_d8;
  ProKey local_b8;
  undefined1 local_88 [32];
  QHash<ReplaceExtraCompilerCacheKey,_QString> local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::fileName();
  fileFixify(&local_58,this,(QString *)local_88,(FileFixifyTypes)0x0,true);
  if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)local_88,"QMAKE_FAILED_REQUIREMENTS");
  bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
  if (bVar5) {
    pQVar1 = this->project;
    ProKey::ProKey(&local_b8,"QMAKE_INTERNAL_PRL_FILE");
    bVar5 = QMakeProject::isEmpty(pQVar1,&local_b8);
    if ((Data *)local_b8.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar5 = !bVar5;
  }
  else {
    bVar5 = false;
  }
  if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if (bVar5) {
    uVar10 = (undefined4)CONCAT71(in_register_00000011,noDummyQmakeAll);
    local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    fileFixify((QStringList *)local_88,this,&Option::mkfile::project_files,(FileFixifyTypes)0x0,true
              );
    escapeFilePaths((QStringList *)&local_d8,this,(QStringList *)local_88);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_88);
    pQVar1 = this->project;
    ProKey::ProKey(&local_b8,"QMAKE_INTERNAL_PRL_FILE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,&local_b8);
    ProString::toQString(&local_118,(ProString *)local_88);
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(&local_f8,this,&local_118);
    pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_f8);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,": \n\t");
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,"@$(QMAKE) -prl ");
    local_148.d.d._0_2_ = 0x20;
    QtPrivate::QStringList_join((QList *)local_130,(QChar *)&local_d8,(longlong)&local_148);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_130);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,' ');
    buildArgs(&local_148,this,true);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_148);
    Qt::endl(pQVar7);
    piVar3 = (int *)CONCAT62(local_148.d.d._2_6_,local_148.d.d._0_2_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT62(local_148.d.d._2_6_,local_148.d.d._0_2_),2,0x10);
      }
    }
    if ((QArrayData *)local_130._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_130._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_130._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_130._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_130._0_8_,2,0x10);
      }
    }
    in_stack_fffffffffffffe9c = uVar10;
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
      }
    }
    noDummyQmakeAll = SUB41(uVar10,0);
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if ((Data *)local_b8.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  }
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  fullBuildArgs((QString *)&local_b8,this);
  local_88._24_8_ = local_b8.super_ProString.m_string.d.size;
  local_88._16_8_ = local_b8.super_ProString.m_string.d.ptr;
  local_88._8_8_ = local_b8.super_ProString.m_string.d.d;
  local_88._0_8_ = anon_var_dwarf_15708f;
  local_b8.super_ProString.m_string.d.d = (Data *)0x0;
  local_b8.super_ProString.m_string.d.ptr = (char16_t *)0x0;
  local_b8.super_ProString.m_string.d.size = 0;
  QStringBuilder<const_char_(&)[9],_QString>::convertTo<QString>
            ((QString *)&local_d8,(QStringBuilder<const_char_(&)[9],_QString> *)local_88);
  if ((Data *)local_88._8_8_ != (Data *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._8_8_,2,0x10);
    }
  }
  if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    pQVar1 = this->project;
    QVar13.m_data = &DAT_0000000c;
    QVar13.m_size = (qsizetype)local_88;
    QString::fromUtf8(QVar13);
    uVar4 = local_88._0_8_;
    config.m_data = (storage_type_conflict *)local_88._8_8_;
    config.m_size = local_88._16_8_;
    bVar5 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    if ((QArrayData *)uVar4 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar4)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar4)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar4)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
      }
    }
    if (!bVar5) {
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(local_88,this,&local_58);
      pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
      pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,": ");
      pQVar1 = this->project;
      local_118.d.d = (pQVar1->m_projectFile).d.d;
      local_118.d.ptr = (pQVar1->m_projectFile).d.ptr;
      local_118.d.size = (pQVar1->m_projectFile).d.size;
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_118.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      fileFixify(&local_f8,this,&local_118,(FileFixifyTypes)0x0,true);
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(&local_b8,this,&local_f8);
      pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_b8);
      QTextStream::operator<<(pQVar7," ");
      if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if (Option::globals->do_cache == true) {
        pQVar2 = &((this->project->super_QMakeEvaluator).m_conffile.d.d)->super_QArrayData;
        lVar11 = (this->project->super_QMakeEvaluator).m_conffile.d.size;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
        if (lVar11 != 0) {
          pQVar1 = this->project;
          local_f8.d.d = (pQVar1->super_QMakeEvaluator).m_conffile.d.d;
          local_f8.d.ptr = (pQVar1->super_QMakeEvaluator).m_conffile.d.ptr;
          local_f8.d.size = (pQVar1->super_QMakeEvaluator).m_conffile.d.size;
          if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          fileFixify((QString *)&local_b8,this,&local_f8,(FileFixifyTypes)0x0,true);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                    (local_88,this,&local_b8);
          pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
          QTextStream::operator<<(pQVar7," ");
          if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate
                        (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        pQVar2 = &((this->project->super_QMakeEvaluator).m_cachefile.d.d)->super_QArrayData;
        lVar11 = (this->project->super_QMakeEvaluator).m_cachefile.d.size;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
        if (lVar11 != 0) {
          pQVar1 = this->project;
          local_f8.d.d = (pQVar1->super_QMakeEvaluator).m_cachefile.d.d;
          local_f8.d.ptr = (pQVar1->super_QMakeEvaluator).m_cachefile.d.ptr;
          local_f8.d.size = (pQVar1->super_QMakeEvaluator).m_cachefile.d.size;
          if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          fileFixify((QString *)&local_b8,this,&local_f8,(FileFixifyTypes)0x0,true);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                    (local_88,this,&local_b8);
          pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
          QTextStream::operator<<(pQVar7," ");
          if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate
                        (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      specdir((QString *)local_88,this);
      uVar4 = local_88._16_8_;
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if ((QMakeLocalFileName *)uVar4 != (QMakeLocalFileName *)0x0) {
        specdir(&local_118,this);
        local_88._16_8_ = local_118.d.size;
        local_88._8_8_ = local_118.d.ptr;
        local_88._0_8_ = local_118.d.d;
        local_118.d.d = (Data *)0x0;
        local_118.d.ptr = (char16_t *)0x0;
        local_118.d.size = 0;
        local_88._24_8_ = "/qmake.conf";
        QStringBuilder<QString,_const_char_(&)[12]>::convertTo<QString>
                  (&local_f8,(QStringBuilder<QString,_const_char_(&)[12]> *)local_88);
        local_b8.super_ProString.m_string.d.d = local_f8.d.d;
        local_b8.super_ProString.m_string.d.ptr = local_f8.d.ptr;
        local_b8.super_ProString.m_string.d.size = local_f8.d.size;
        if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        string.d.d._4_4_ = in_stack_fffffffffffffe9c;
        string.d.d._0_4_ = in_stack_fffffffffffffe98;
        string.d.ptr = (char16_t *)in_stack_fffffffffffffea0;
        string.d.size = (qsizetype)in_stack_fffffffffffffea8;
        Option::fixString((QString *)&stack0xfffffffffffffea0,string,(uchar)&local_b8);
        if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_b8.super_ProString.m_string.d.size = (qsizetype)pDStack_150;
        if (in_stack_fffffffffffffea0 != (QArrayData *)0x0) {
          LOCK();
          (in_stack_fffffffffffffea0->ref_)._q_value.super___atomic_base<int>._M_i =
               (in_stack_fffffffffffffea0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        file.d.d._4_4_ = in_stack_fffffffffffffe9c;
        file.d.d._0_4_ = in_stack_fffffffffffffe98;
        file.d.ptr = (char16_t *)in_stack_fffffffffffffea0;
        file.d.size = (qsizetype)in_stack_fffffffffffffea8;
        local_b8.super_ProString.m_string.d.d = (Data *)in_stack_fffffffffffffea0;
        local_b8.super_ProString.m_string.d.ptr = (char16_t *)in_stack_fffffffffffffea8;
        fileInfo((MakefileGenerator *)local_130,file);
        cVar6 = QFileInfo::exists();
        QFileInfo::~QFileInfo((QFileInfo *)local_130);
        if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (in_stack_fffffffffffffea0 != (QArrayData *)0x0) {
          LOCK();
          (in_stack_fffffffffffffea0->ref_)._q_value.super___atomic_base<int>._M_i =
               (in_stack_fffffffffffffea0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((in_stack_fffffffffffffea0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(in_stack_fffffffffffffea0,2,0x10);
          }
        }
        if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (cVar6 != '\0') {
          specdir(&local_f8,this);
          local_88._16_8_ = local_f8.d.size;
          local_88._8_8_ = local_f8.d.ptr;
          local_88._0_8_ = local_f8.d.d;
          local_f8.d.size = 0;
          local_f8.d.d = (Data *)0x0;
          local_f8.d.ptr = (char16_t *)0x0;
          local_88._24_8_ = &Option::dir_sep;
          local_68.d = (Data *)0x2b731c;
          escapeDependencyPath<QStringBuilder<QString,QString&>,char_const(&)[11]>
                    ((QString *)&local_b8,this,
                     (QStringBuilder<QStringBuilder<QString,_QString_&>,_const_char_(&)[11]> *)
                     local_88);
          pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_b8);
          QTextStream::operator<<(pQVar7," ");
          if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate
                        (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      pQVar1 = this->project;
      ProKey::ProKey((ProKey *)local_88,"QMAKE_INTERNAL_INCLUDED_FILES");
      pPVar8 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88);
      escapeDependencyPaths((ProStringList *)&local_b8,this,pPVar8);
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      QVar14.m_data = (storage_type *)0x5;
      QVar14.m_size = (qsizetype)local_88;
      QString::fromUtf8(QVar14);
      local_f8.d.d = (Data *)local_88._0_8_;
      local_f8.d.ptr = (char16_t *)local_88._8_8_;
      local_f8.d.size = local_88._16_8_;
      ProStringList::join((QString *)local_88,(ProStringList *)&local_b8,&local_f8);
      pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
      pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,"\n\t");
      pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_d8);
      Qt::endl(pQVar7);
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar1 = this->project;
      ProKey::ProKey((ProKey *)local_88,"QMAKE_MAKE_QMAKE_EXTRA_COMMANDS");
      pPVar8 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88);
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if ((pPVar8->super_QList<ProString>).d.size != 0) {
        pQVar7 = (QTextStream *)QTextStream::operator<<(t,"\t");
        QVar15.m_data = (storage_type *)0x2;
        QVar15.m_size = (qsizetype)local_88;
        QString::fromUtf8(QVar15);
        local_f8.d.d = (Data *)local_88._0_8_;
        local_f8.d.ptr = (char16_t *)local_88._8_8_;
        local_f8.d.size = local_88._16_8_;
        ProStringList::join((QString *)local_88,pPVar8,&local_f8);
        pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_88);
        Qt::endl(pQVar7);
        if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if ((Data *)local_b8.super_ProString.m_string.d.size != (Data *)0x0) {
        lVar11 = 0;
        pDVar12 = (Data *)0x0;
        pDVar9 = (Data *)local_b8.super_ProString.m_string.d.size;
        do {
          if (*(int *)((long)((long)local_b8.super_ProString.m_string.d.ptr + 0x18) + lVar11 + 4) !=
              0) {
            pQVar7 = operator<<(t,(ProString *)
                                  ((long)&(((RefCount *)local_b8.super_ProString.m_string.d.ptr)->
                                          atomic)._q_value.super___atomic_base<int>._M_i + lVar11));
            QTextStream::operator<<(pQVar7,":\n");
            pDVar9 = (Data *)local_b8.super_ProString.m_string.d.size;
          }
          pDVar12 = (Data *)((long)&(pDVar12->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int>._M_i + 1);
          lVar11 = lVar11 + 0x30;
        } while (pDVar12 < pDVar9);
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_b8);
    }
  }
  pQVar1 = this->project;
  ProKey::ProKey(&local_b8,"QMAKE_ORIG_TARGET");
  QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,&local_b8);
  bVar5 = ProString::operator==((ProString *)local_88,"qmake");
  if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar5) {
    pQVar7 = (QTextStream *)QTextStream::operator<<(t,"qmake: FORCE\n\t@");
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_d8);
    pQVar7 = (QTextStream *)Qt::endl(pQVar7);
    Qt::endl(pQVar7);
    if (noDummyQmakeAll == false) {
      QTextStream::operator<<(t,"qmake_all: FORCE\n\n");
    }
  }
  if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QMakeProject *)local_58.d.d != (QMakeProject *)0x0) {
    LOCK();
    (((Type *)&((QMakeEvaluator *)&(local_58.d.d)->super_QArrayData)->m_caller)->
    super___atomic_base<int>)._M_i =
         (((Type *)&((QMakeEvaluator *)&(local_58.d.d)->super_QArrayData)->m_caller)->
         super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    if ((((Type *)&((QMakeEvaluator *)&(local_58.d.d)->super_QArrayData)->m_caller)->
        super___atomic_base<int>)._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeMakeQmake(QTextStream &t, bool noDummyQmakeAll)
{
    QString ofile = fileFixify(Option::output.fileName());
    if(project->isEmpty("QMAKE_FAILED_REQUIREMENTS") && !project->isEmpty("QMAKE_INTERNAL_PRL_FILE")) {
        QStringList files = escapeFilePaths(fileFixify(Option::mkfile::project_files));
        t << escapeDependencyPath(project->first("QMAKE_INTERNAL_PRL_FILE").toQString()) << ": \n\t"
          << "@$(QMAKE) -prl " << files.join(' ') << ' ' << buildArgs(true) << Qt::endl;
    }

        QString qmake = "$(QMAKE)" + fullBuildArgs();
        if(!ofile.isEmpty() && !project->isActiveConfig("no_autoqmake")) {
            t << escapeDependencyPath(ofile) << ": "
              << escapeDependencyPath(fileFixify(project->projectFile())) << " ";
            if (Option::globals->do_cache) {
                if (!project->confFile().isEmpty())
                    t <<  escapeDependencyPath(fileFixify(project->confFile())) << " ";
                if (!project->cacheFile().isEmpty())
                    t <<  escapeDependencyPath(fileFixify(project->cacheFile())) << " ";
            }
            if(!specdir().isEmpty()) {
                if (exists(Option::normalizePath(specdir() + "/qmake.conf")))
                    t << escapeDependencyPath(specdir() + Option::dir_sep + "qmake.conf") << " ";
            }
            const ProStringList &included = escapeDependencyPaths(project->values("QMAKE_INTERNAL_INCLUDED_FILES"));
            t << included.join(QString(" \\\n\t\t")) << "\n\t"
              << qmake << Qt::endl;
            const ProStringList &extraCommands = project->values("QMAKE_MAKE_QMAKE_EXTRA_COMMANDS");
            if (!extraCommands.isEmpty())
                t << "\t" << extraCommands.join(QString("\n\t")) << Qt::endl;
            for(int include = 0; include < included.size(); ++include) {
                const ProString &i = included.at(include);
                if(!i.isEmpty())
                    t << i << ":\n";
            }
        }
        if(project->first("QMAKE_ORIG_TARGET") != "qmake") {
            t << "qmake: FORCE\n\t@" << qmake << Qt::endl << Qt::endl;
            if (!noDummyQmakeAll)
                t << "qmake_all: FORCE\n\n";
        }
}